

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O0

uint16 crnlib::etc1_block::pack_color4(uint r,uint g,uint b,bool scaled,uint bias)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint bias_local;
  uint uStack_10;
  bool scaled_local;
  uint b_local;
  uint g_local;
  uint r_local;
  
  bias_local = b;
  uStack_10 = g;
  b_local = r;
  if (scaled) {
    b_local = (r * 0xf + bias) / 0xff;
    uStack_10 = (g * 0xf + bias) / 0xff;
    bias_local = (b * 0xf + bias) / 0xff;
  }
  uVar1 = math::minimum<unsigned_int>(b_local,0xf);
  uVar2 = math::minimum<unsigned_int>(uStack_10,0xf);
  uVar3 = math::minimum<unsigned_int>(bias_local,0xf);
  return (ushort)uVar3 | (ushort)(uVar2 << 4) | (ushort)(uVar1 << 8);
}

Assistant:

uint16 etc1_block::pack_color4(uint r, uint g, uint b, bool scaled, uint bias)
    {
        if (scaled)
        {
            r = (r * 15U + bias) / 255U;
            g = (g * 15U + bias) / 255U;
            b = (b * 15U + bias) / 255U;
        }

        r = math::minimum(r, 15U);
        g = math::minimum(g, 15U);
        b = math::minimum(b, 15U);

        return static_cast<uint16>(b | (g << 4U) | (r << 8U));
    }